

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::SpaceUsedExcludingSelfLong(ExtensionSet *this)

{
  size_t sVar1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  
  sVar3 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_node_count << 5;
  for (p_Var2 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    sVar1 = Extension::SpaceUsedExcludingSelfLong((Extension *)&p_Var2[1]._M_parent);
    sVar3 = sVar3 + sVar1;
  }
  return sVar3;
}

Assistant:

size_t ExtensionSet::SpaceUsedExcludingSelfLong() const {
  size_t total_size =
      extensions_.size() * sizeof(ExtensionMap::value_type);
  for (ExtensionMap::const_iterator iter = extensions_.begin(),
       end = extensions_.end();
       iter != end;
       ++iter) {
    total_size += iter->second.SpaceUsedExcludingSelfLong();
  }
  return total_size;
}